

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ctl.c
# Opt level: O2

char * get_gost_engine_param(int param)

{
  char *pcVar1;
  
  if (2 < (uint)param) {
    return (char *)0x0;
  }
  pcVar1 = gost_params[(uint)param];
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv(gost_envnames[(uint)param]);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      CRYPTO_free((void *)0x0);
      pcVar1 = CRYPTO_strdup(pcVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ctl.c"
                             ,0x36);
      gost_params[(uint)param] = pcVar1;
    }
  }
  return pcVar1;
}

Assistant:

const char *get_gost_engine_param(int param)
{
    char *tmp;
    if (param < 0 || param >= GOST_PARAM_MAX)
        return NULL;
    if (gost_params[param] != NULL) {
        return gost_params[param];
    }
    tmp = getenv(gost_envnames[param]);
    if (tmp) {
        OPENSSL_free(gost_params[param]);
        gost_params[param] = BUF_strdup(tmp);
        return gost_params[param];
    }
    return NULL;
}